

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void testTimestamp(void)

{
  uint64_t timestamp;
  C *pCVar1;
  int iVar2;
  bool bVar3;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_88;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_68;
  Time local_44;
  
  iVar2 = 0x14;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    timestamp = axl::sys::getTimestamp();
    axl::sys::Time::Time(&local_44,timestamp);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
              (&local_68,"%h:%m:%s.%l.%c");
    axl::sys::Time::format((String *)&local_88,&local_44,&local_68);
    pCVar1 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
    if (local_88.m_length != 0) {
      pCVar1 = local_88.m_p;
    }
    printf("%s: %llu\n",pCVar1,timestamp);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_88);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_68);
  }
  return;
}

Assistant:

void
testTimestamp() {
	for (int i = 0; i < 20; i++) {
		uint64_t t1 = sys::getTimestamp();
		printf("%s: %llu\n", sys::Time(t1).format("%h:%m:%s.%l.%c").sz(), t1);
	}
}